

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mars.cpp
# Opt level: O1

void __thiscall MARS::f_mix(MARS *this,uint *a,uint *b,uint *c,uint *d)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *a;
  uVar2 = *b ^ (this->S)._M_elems[uVar1 & 0xff];
  *b = uVar2;
  *b = uVar2 + *(int *)((long)(this->S)._M_elems + (ulong)(uVar1 >> 6 & 0x3fc) + 0x400);
  uVar1 = *a;
  *a = uVar1 << 8 | uVar1 >> 0x18;
  *c = *c + *(int *)((long)(this->S)._M_elems + (ulong)(uVar1 >> 0xe & 0x3fc));
  *d = *d ^ (this->S)._M_elems[(ulong)(byte)*a + 0x100];
  return;
}

Assistant:

void MARS::f_mix(unsigned &a, unsigned &b, unsigned &c, unsigned &d) {
    unsigned r = rotr(a, 8);
    b ^= S[a & 255];
    b += S[(r & 255) + 256];
    r = rotr(a, 16);
    a = rotr(a, 24);
    c += S[r & 255];
    d ^= S[(a & 255) + 256];
}